

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_test.cpp
# Opt level: O0

void __thiscall license::test::set_and_compare_data::test_method(set_and_compare_data *this)

{
  byte bVar1;
  unit_test_log_t *puVar2;
  bool bVar3;
  byte *pbVar4;
  lazy_ostream *prev;
  basic_cstring<const_char> local_a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]> local_90;
  assertion_result local_70;
  basic_cstring<const_char> local_58;
  basic_cstring<const_char> local_48 [2];
  undefined1 local_28 [8];
  HwIdentifier pc_id;
  array<unsigned_char,_7UL> data;
  set_and_compare_data *this_local;
  
  pc_id.m_data._M_elems[4] = 'B';
  pc_id.m_data._M_elems[5] = 'B';
  pc_id.m_data._M_elems[6] = 'B';
  pc_id.m_data._M_elems[0] = 0xff;
  pc_id.m_data._M_elems[1] = 'B';
  pc_id.m_data._M_elems[2] = 'B';
  pc_id.m_data._M_elems[3] = 'B';
  hw_identifier::HwIdentifier::HwIdentifier((HwIdentifier *)local_28);
  hw_identifier::HwIdentifier::set_data
            ((HwIdentifier *)local_28,(array<unsigned_char,_7UL> *)&pc_id.m_data);
  pbVar4 = std::array<unsigned_char,_7UL>::operator[]((array<unsigned_char,_7UL> *)&pc_id.m_data,0);
  bVar1 = *pbVar4;
  pbVar4 = std::array<unsigned_char,_7UL>::operator[]((array<unsigned_char,_7UL> *)&pc_id.m_data,0);
  *pbVar4 = bVar1 & 0x1f;
  do {
    puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/hw_identifier/hw_identifier_test.cpp"
               ,0x84);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_58);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,local_48,0x23,&local_58);
    bVar3 = hw_identifier::HwIdentifier::data_match
                      ((HwIdentifier *)local_28,(array<unsigned_char,_7UL> *)&pc_id.m_data);
    boost::test_tools::assertion_result::assertion_result(&local_70,bVar3);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_90,prev,(char (*) [11])"Data match");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/hw_identifier/hw_identifier_test.cpp"
               ,0x84);
    boost::test_tools::tt_detail::report_assertion(&local_70,&local_90,&local_a0,0x23,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>::
    ~lazy_ostream_impl(&local_90);
    boost::test_tools::assertion_result::~assertion_result(&local_70);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  hw_identifier::HwIdentifier::~HwIdentifier((HwIdentifier *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(set_and_compare_data) {
	array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> data = {0xFF, 0x42, 0x42, 0x42, 0x42, 0x42, 0x42};
	HwIdentifier pc_id;
	pc_id.set_data(data);
	data[0] = data[0] & 0x1f;
	BOOST_CHECK_MESSAGE(pc_id.data_match(data), "Data match");
}